

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O2

t_int * upsampling_perform_0(t_int *w)

{
  long lVar1;
  t_int tVar2;
  t_int tVar3;
  undefined4 *puVar4;
  long lVar5;
  
  lVar1 = w[1];
  puVar4 = (undefined4 *)w[2];
  tVar2 = w[3];
  tVar3 = w[4];
  for (lVar5 = 0; (int)tVar3 * (int)tVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
    puVar4[lVar5] = 0;
  }
  for (lVar5 = 0; (int)tVar3 != (int)lVar5; lVar5 = lVar5 + 1) {
    *puVar4 = *(undefined4 *)(lVar1 + lVar5 * 4);
    puVar4 = puVar4 + (int)tVar2;
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_0(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */

  int n=parent*up;
  t_sample *dummy = out;

  while(n--)*out++=0;

  n = parent;
  out = dummy;
  while(n--){
    *out=*in++;
    out+=up;
  }

  return (w+5);
}